

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_set.h
# Opt level: O2

vector<long,_std::allocator<long>_> *
vset::set_union<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *v1,vector<long,_std::allocator<long>_> *v2)

{
  pointer plVar1;
  pointer plVar2;
  long e;
  BPlusTree<long> tree;
  Iterator local_88;
  long local_78;
  BPlusTree<long> local_70;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BPlusTree<long>::BPlusTree(&local_70,false);
  plVar1 = (v1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar2 = (v1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    local_88.node_ptr = (BPlusTree<long> *)*plVar2;
    BPlusTree<long>::insert(&local_70,(long *)&local_88);
  }
  plVar1 = (v2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar2 = (v2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    local_88.node_ptr = (BPlusTree<long> *)*plVar2;
    BPlusTree<long>::insert(&local_70,(long *)&local_88);
  }
  local_88 = BPlusTree<long>::begin(&local_70);
  while (local_88.node_ptr != (BPlusTree<long> *)0x0) {
    local_78 = BPlusTree<long>::Iterator::operator*(&local_88);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_78);
    BPlusTree<long>::Iterator::operator++(&local_88);
  }
  BPlusTree<long>::~BPlusTree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> set_union(const std::vector<T>& v1, const std::vector<T>& v2) {
    std::vector<T> result;
    BPlusTree<T> tree;
    for (T e : v1)
        tree.insert(e);

    for (T e : v2)
        tree.insert(e);

    for (auto it = tree.begin(); it != nullptr; ++it) {
        result.push_back(*it);
    }
    return result;
}